

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O2

_Bool av1_hash_table_create(hash_table *p_hash_table)

{
  Vector **ppVVar1;
  _Bool _Var2;
  
  if (p_hash_table->p_lookup_table == (Vector **)0x0) {
    ppVVar1 = (Vector **)aom_calloc(0x80000,8);
    p_hash_table->p_lookup_table = ppVVar1;
    _Var2 = ppVVar1 != (Vector **)0x0;
  }
  else {
    clear_all(p_hash_table);
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool av1_hash_table_create(hash_table *p_hash_table) {
  if (p_hash_table->p_lookup_table != NULL) {
    clear_all(p_hash_table);
    return true;
  }
  p_hash_table->p_lookup_table =
      (Vector **)aom_calloc(kMaxAddr, sizeof(p_hash_table->p_lookup_table[0]));
  if (!p_hash_table->p_lookup_table) return false;
  return true;
}